

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeDisc.cpp
# Opt level: O2

void pzshape::TPZShapeDisc::Initialize
               (int order,int dimension,MShapeType shapetype,TPZShapeData *data)

{
  int iVar1;
  
  (*(data->fH1ConnectOrders).super_TPZVec<int>._vptr_TPZVec[3])(&data->fH1ConnectOrders,1);
  *(data->fH1ConnectOrders).super_TPZVec<int>.fStore = order;
  (*(data->fCornerNodeIds).super_TPZVec<long>._vptr_TPZVec[3])(&data->fCornerNodeIds,0);
  (*(data->fH1NumConnectShape).super_TPZVec<int>._vptr_TPZVec[3])(&data->fH1NumConnectShape,1);
  iVar1 = NShapeF(order,dimension,shapetype);
  *(data->fH1NumConnectShape).super_TPZVec<int>.fStore = iVar1;
  TPZFMatrix<double>::Resize(&(data->fPhi).super_TPZFMatrix<double>,(long)iVar1,1);
  TPZFMatrix<double>::Resize(&(data->fDPhi).super_TPZFMatrix<double>,(long)dimension,(long)iVar1);
  return;
}

Assistant:

void TPZShapeDisc::Initialize(int order, int dimension, MShapeType shapetype, TPZShapeData &data)
{
    data.fH1ConnectOrders.resize(1);
    data.fH1ConnectOrders[0] = order;
    data.fCornerNodeIds.resize(0);
    data.fH1NumConnectShape.resize(1);
    int64_t nshape = NShapeF(order, dimension, shapetype);
    data.fH1NumConnectShape[0] = nshape;
    data.fPhi.Resize(nshape,1);
    data.fDPhi.Resize(dimension, nshape);

}